

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void ClipperLib::CleanPolygon(Path *in_poly,Path *out_poly,double distance)

{
  undefined8 *puVar1;
  int *piVar2;
  undefined4 *puVar3;
  undefined1 auVar4 [16];
  double distSqrd;
  cInt cVar5;
  undefined8 uVar6;
  bool bVar7;
  int *piVar8;
  ulong uVar9;
  int *piVar10;
  int *piVar11;
  ulong uVar12;
  size_type __new_size;
  pointer pIVar13;
  long lVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  
  pIVar13 = (in_poly->
            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>)._M_impl
            .super__Vector_impl_data._M_start;
  lVar14 = (long)(in_poly->
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
                 _M_impl.super__Vector_impl_data._M_finish - (long)pIVar13;
  if (lVar14 == 0) {
    pIVar13 = (out_poly->
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if ((out_poly->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
        _M_impl.super__Vector_impl_data._M_finish != pIVar13) {
      (out_poly->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
      _M_impl.super__Vector_impl_data._M_finish = pIVar13;
    }
    return;
  }
  uVar15 = lVar14 >> 4;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar15;
  uVar9 = 0xffffffffffffffff;
  if (SUB168(auVar4 * ZEXT816(0x28),8) == 0) {
    uVar9 = SUB168(auVar4 * ZEXT816(0x28),0);
  }
  piVar8 = (int *)operator_new__(uVar9);
  lVar14 = 0;
  do {
    puVar1 = (undefined8 *)((long)piVar8 + lVar14 + 8);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar14 = lVar14 + 0x28;
  } while (uVar15 * 0x28 != lVar14);
  uVar9 = 1;
  piVar10 = piVar8;
  do {
    cVar5 = pIVar13->Y;
    *(cInt *)(piVar10 + 2) = pIVar13->X;
    *(cInt *)(piVar10 + 4) = cVar5;
    uVar12 = 0;
    if (uVar15 != uVar9) {
      uVar12 = uVar9;
    }
    *(int **)(piVar10 + 6) = piVar8 + uVar12 * 10;
    *(int **)(piVar8 + uVar12 * 10 + 8) = piVar10;
    *piVar10 = 0;
    lVar14 = (-(ulong)(uVar15 == 0) - uVar15) + uVar9;
    uVar9 = uVar9 + 1;
    piVar10 = piVar10 + 10;
    pIVar13 = pIVar13 + 1;
  } while (lVar14 != 0);
  piVar10 = piVar8;
  if (*piVar8 == 0) {
    distSqrd = distance * distance;
    do {
      while( true ) {
        piVar11 = *(int **)(piVar10 + 6);
        piVar2 = *(int **)(piVar10 + 8);
        if (piVar11 == piVar2) goto LAB_0029780f;
        dVar16 = (double)*(long *)(piVar10 + 2) - (double)*(long *)(piVar2 + 2);
        dVar17 = (double)*(long *)(piVar10 + 4) - (double)*(long *)(piVar2 + 4);
        lVar14 = -1;
        if (distSqrd < dVar16 * dVar16 + dVar17 * dVar17) break;
LAB_002977ef:
        piVar10 = piVar2;
        *(int **)(piVar10 + 6) = piVar11;
        *(int **)(piVar11 + 8) = piVar10;
        *piVar10 = 0;
        uVar15 = uVar15 + lVar14;
      }
      dVar17 = (double)*(long *)(piVar2 + 2) - (double)*(long *)(piVar11 + 2);
      dVar16 = (double)*(long *)(piVar2 + 4) - (double)*(long *)(piVar11 + 4);
      if (dVar17 * dVar17 + dVar16 * dVar16 <= distSqrd) {
        lVar14 = *(long *)(piVar11 + 6);
        puVar3 = *(undefined4 **)(piVar11 + 8);
        *(long *)(puVar3 + 6) = lVar14;
        *(undefined4 **)(lVar14 + 0x20) = puVar3;
        *puVar3 = 0;
        piVar11 = *(int **)(piVar10 + 6);
        lVar14 = -2;
        piVar2 = *(int **)(piVar10 + 8);
        goto LAB_002977ef;
      }
      bVar7 = SlopesNearCollinear((IntPoint *)(piVar2 + 2),(IntPoint *)(piVar10 + 2),
                                  (IntPoint *)(piVar11 + 2),distSqrd);
      if (bVar7) goto LAB_002977ef;
      *piVar10 = 1;
      piVar10 = piVar11;
    } while (*piVar11 == 0);
  }
LAB_0029780f:
  __new_size = 0;
  if (2 < uVar15) {
    __new_size = uVar15;
  }
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::resize
            (out_poly,__new_size);
  if (2 < uVar15) {
    lVar14 = 0;
    do {
      uVar6 = *(undefined8 *)(piVar10 + 4);
      puVar1 = (undefined8 *)
               ((long)&((out_poly->
                        super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                        )._M_impl.super__Vector_impl_data._M_start)->X + lVar14);
      *puVar1 = *(undefined8 *)(piVar10 + 2);
      puVar1[1] = uVar6;
      piVar10 = *(int **)(piVar10 + 6);
      lVar14 = lVar14 + 0x10;
      uVar15 = uVar15 - 1;
    } while (uVar15 != 0);
  }
  operator_delete__(piVar8);
  return;
}

Assistant:

void CleanPolygon(const Path& in_poly, Path& out_poly, double distance)
{
  //distance = proximity in units/pixels below which vertices
  //will be stripped. Default ~= sqrt(2).
  
  size_t size = in_poly.size();
  
  if (size == 0) 
  {
    out_poly.clear();
    return;
  }

  OutPt* outPts = new OutPt[size];
  for (size_t i = 0; i < size; ++i)
  {
    outPts[i].Pt = in_poly[i];
    outPts[i].Next = &outPts[(i + 1) % size];
    outPts[i].Next->Prev = &outPts[i];
    outPts[i].Idx = 0;
  }

  double distSqrd = distance * distance;
  OutPt* op = &outPts[0];
  while (op->Idx == 0 && op->Next != op->Prev) 
  {
    if (PointsAreClose(op->Pt, op->Prev->Pt, distSqrd))
    {
      op = ExcludeOp(op);
      size--;
    } 
    else if (PointsAreClose(op->Prev->Pt, op->Next->Pt, distSqrd))
    {
      ExcludeOp(op->Next);
      op = ExcludeOp(op);
      size -= 2;
    }
    else if (SlopesNearCollinear(op->Prev->Pt, op->Pt, op->Next->Pt, distSqrd))
    {
      op = ExcludeOp(op);
      size--;
    }
    else
    {
      op->Idx = 1;
      op = op->Next;
    }
  }

  if (size < 3) size = 0;
  out_poly.resize(size);
  for (size_t i = 0; i < size; ++i)
  {
    out_poly[i] = op->Pt;
    op = op->Next;
  }
  delete [] outPts;
}